

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prototype1.cpp
# Opt level: O0

int main(void)

{
  Maze *pMVar1;
  Wall *this;
  Room *this_00;
  Door *pDVar2;
  void *pvVar3;
  ostream *this_01;
  BombedWall *this_02;
  RoomWithABomb *this_03;
  MazePrototypeFactory local_78 [8];
  MazePrototypeFactory bombedMazeFactory;
  Maze *maze;
  MazePrototypeFactory local_38 [8];
  MazePrototypeFactory simpleMazeFactory;
  MazeGame local_10;
  MazeGame game;
  
  MazeGame::MazeGame(&local_10);
  pMVar1 = (Maze *)operator_new(0x10);
  Maze::Maze(pMVar1);
  this = (Wall *)operator_new(8);
  Wall::Wall(this);
  this_00 = (Room *)operator_new(0x30);
  Room::Room(this_00,0);
  pDVar2 = (Door *)operator_new(0x18);
  Door::Door(pDVar2);
  MazePrototypeFactory::MazePrototypeFactory(local_38,pMVar1,this,this_00,pDVar2);
  pvVar3 = (void *)MazeGame::CreateMaze((MazeFactory *)&local_10);
  this_01 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,pvVar3);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  pMVar1 = (Maze *)operator_new(0x10);
  Maze::Maze(pMVar1);
  this_02 = (BombedWall *)operator_new(0x10);
  BombedWall::BombedWall(this_02);
  this_03 = (RoomWithABomb *)operator_new(0x30);
  RoomWithABomb::RoomWithABomb(this_03,0,false);
  pDVar2 = (Door *)operator_new(0x18);
  Door::Door(pDVar2);
  MazePrototypeFactory::MazePrototypeFactory(local_78,pMVar1,(Wall *)this_02,(Room *)this_03,pDVar2)
  ;
  return 0;
}

Assistant:

int main()
{
    MazeGame game;

    MazePrototypeFactory simpleMazeFactory(
        new Maze, new Wall, new Room, new Door
    );
    Maze* maze = game.CreateMaze(simpleMazeFactory);
    std::cout << maze << std::endl;

    MazePrototypeFactory bombedMazeFactory(
        new Maze, new BombedWall,
        new RoomWithABomb, new Door
    );
}